

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O1

void duckdb_zstd::HUF_simpleQuickSort(nodeElt *arr,int low,int high)

{
  uint uVar1;
  nodeElt nVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar4 = high - low;
  if (iVar4 < 8) {
    if (0 < iVar4) {
      uVar6 = 1;
      do {
        nVar2 = arr[(long)low + uVar6];
        uVar8 = uVar6;
        do {
          uVar9 = uVar8 - 1 & 0xffffffff;
          if (nVar2.count <= arr[(long)low + uVar9].count) goto LAB_012a0a29;
          arr[(long)low + uVar8] = arr[(long)low + uVar9];
          bVar3 = 1 < (long)uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar3);
        uVar8 = 0;
LAB_012a0a29:
        arr[(long)low + (long)(int)uVar8] = nVar2;
        uVar6 = uVar6 + 1;
      } while (uVar6 != iVar4 + 1);
    }
  }
  else if (low < high) {
    do {
      lVar5 = (long)high;
      uVar1 = arr[lVar5].count;
      iVar4 = low + -1;
      lVar7 = (long)low;
      do {
        if (uVar1 < arr[lVar7].count) {
          nVar2 = arr[(long)iVar4 + 1];
          arr[(long)iVar4 + 1] = arr[lVar7];
          arr[lVar7] = nVar2;
          iVar4 = iVar4 + 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar5 != lVar7);
      nVar2 = arr[(long)iVar4 + 1];
      arr[(long)iVar4 + 1] = arr[lVar5];
      arr[lVar5] = nVar2;
      if ((iVar4 + 1) - low < high - (iVar4 + 1)) {
        HUF_simpleQuickSort(arr,low,iVar4);
        low = iVar4 + 2;
      }
      else {
        HUF_simpleQuickSort(arr,iVar4 + 2,high);
        high = iVar4;
      }
    } while (low < high);
  }
  return;
}

Assistant:

static void HUF_simpleQuickSort(nodeElt arr[], int low, int high) {
    int const kInsertionSortThreshold = 8;
    if (high - low < kInsertionSortThreshold) {
        HUF_insertionSort(arr, low, high);
        return;
    }
    while (low < high) {
        int const idx = HUF_quickSortPartition(arr, low, high);
        if (idx - low < high - idx) {
            HUF_simpleQuickSort(arr, low, idx - 1);
            low = idx + 1;
        } else {
            HUF_simpleQuickSort(arr, idx + 1, high);
            high = idx - 1;
        }
    }
}